

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ButtonUI.cpp
# Opt level: O3

void __thiscall nite::ButtonUI::render(ButtonUI *this,Vec2 *offset)

{
  Vec2 *this_00;
  float *this_01;
  float fVar1;
  bool bVar2;
  int iVar3;
  RenderableTextureT *pRVar4;
  RenderableFont *pRVar5;
  float fVar6;
  undefined1 auStack_98 [8];
  Color bc;
  undefined1 auStack_78 [8];
  Color tc;
  Vec2 local_5c;
  Vec2 rp;
  Vec2 cs;
  float fStack_44;
  Vec2 is;
  Vec2 local_38;
  Vec2 p;
  
  if (render(nite::Vec2_const&)::blank == '\0') {
    iVar3 = __cxa_guard_acquire(&render(nite::Vec2_const&)::blank);
    if (iVar3 != 0) {
      auStack_98 = (undefined1  [8])&bc.b;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)auStack_98,"data/texture/empty.png","");
      Texture::Texture(&render::blank,(string *)auStack_98);
      if (auStack_98 != (undefined1  [8])&bc.b) {
        operator_delete((void *)auStack_98);
      }
      __cxa_atexit(Texture::~Texture,&render::blank,&__dso_handle);
      __cxa_guard_release(&render(nite::Vec2_const&)::blank);
    }
  }
  Vec2::Vec2(&local_38,(this->super_BaseUIComponent).position.x + offset->x,
             (this->super_BaseUIComponent).position.y + offset->y);
  this_00 = &(this->super_BaseUIComponent).size;
  Vec2::operator+(this_00,&(this->super_BaseUIComponent).padding);
  Color::Color((Color *)auStack_98,&this->baseColor);
  Color::Color((Color *)auStack_78,&this->textColor);
  iVar3 = this->buttonState;
  if (iVar3 == 1) {
    Color::operator*((Color *)&cs.y,0.5);
    auStack_98 = (undefined1  [8])CONCAT44(fStack_44,cs.y);
    Color::operator*((Color *)&cs.y,0.5);
    iVar3 = this->buttonState;
  }
  if (iVar3 == 2) {
    Color::operator*((Color *)&cs.y,1.0);
    auStack_98 = (undefined1  [8])CONCAT44(fStack_44,cs.y);
    Color::operator*((Color *)&cs.y,1.0);
  }
  Vec2::operator*(&local_5c,0.5);
  fVar6 = (this->secondColor).a;
  if ((fVar6 != 0.0) || (NAN(fVar6))) {
    Color::Color((Color *)&cs.y,&this->secondColor);
  }
  else {
    Color::operator*((Color *)&cs.y,0.95);
  }
  setColor((Color *)&cs.y);
  Texture::draw(&render::blank,local_38.x - local_5c.x,local_38.y - local_5c.y,rp.x,rp.y,0.0,0.0,0.0
               );
  setColor((Color *)auStack_98);
  fVar6 = (this->borderThickness).x;
  fVar1 = (this->borderThickness).y;
  Texture::draw(&render::blank,(local_38.x - local_5c.x) + fVar6,(local_38.y - local_5c.y) + fVar1,
                rp.x - (fVar6 + fVar6),rp.y - (fVar1 + fVar1),0.0,0.0,0.0);
  bVar2 = Texture::isLoaded(&this->buttonImage);
  if (bVar2) {
    fVar6 = Vec2::avg(this_00);
    cs.x = fVar6 * 0.65;
    this_01 = &cs.y;
    Texture::getSize((Texture *)this_01);
    fVar6 = Vec2::avg((Vec2 *)this_01);
    if (cs.x < fVar6) {
      do {
        cs.y = cs.y * 0.9;
        fStack_44 = fStack_44 * 0.9;
        fVar6 = Vec2::avg((Vec2 *)this_01);
      } while (cs.x < fVar6);
    }
    setColor((Color *)auStack_78);
    pRVar4 = Texture::draw(&this->buttonImage,local_38.x,fStack_44 * -0.09 + local_38.y,cs.y,
                           fStack_44,0.5,0.5,0.0);
    if (pRVar4 != (RenderableTextureT *)0x0) {
      pRVar4->smooth = true;
    }
  }
  else {
    setColor((Color *)auStack_78);
    pRVar5 = Font::draw(&this->font,&this->text,local_38.x,local_38.y,0.5,0.35,0.0);
    if (pRVar5 != (RenderableFont *)0x0) {
      pRVar5->shadow = false;
    }
  }
  return;
}

Assistant:

void nite::ButtonUI::render(const nite::Vec2 &offset){
    static nite::Texture blank("data/texture/empty.png");
    nite::Vec2 p(position.x + offset.x, position.y + offset.y);
    // nite::print(padding);
    auto cs = size + padding;
    nite::Color bc = baseColor;
    nite::Color tc = textColor;
    if(buttonState == 1){
        bc = baseColor * 0.5f;
        tc = textColor * 0.5f;
    }
    if(buttonState == 2){
        bc = baseColor * 1.0f;
        tc = textColor * 1.0f;
    }
    nite::Vec2 &bt = borderThickness;
    nite::Vec2 rp(cs * 0.5f);
    //   nite::setColor(nite::Color(0.0f, 0.5f));
    //   blank.draw(p.x - rp.x + 3.0f, p.y - rp.y + 3.0f, cs.x, cs.y, 0.0f, 0.0f, 0.0f);
    nite::setColor(secondColor.a == 0.0f ? baseColor * 0.95f : secondColor);  
    blank.draw(p.x - rp.x, p.y - rp.y, cs.x, cs.y, 0.0f, 0.0f, 0.0f);
    nite::setColor(bc);  
    blank.draw(p.x - rp.x + bt.x, p.y - rp.y + bt.y, cs.x - bt.x * 2.0f, cs.y - bt.y * 2.0f, 0.0f, 0.0f, 0.0f);
    //   blank.draw(p.x - rp.x, p.y - rp.y, cs.x, cs.y, 0.0f, 0.0f, 0.0f);  

    if(!buttonImage.isLoaded()){
        nite::setColor(tc);  
        auto *ref = font.draw(text, p.x, p.y, 0.5f, 0.35f, 0.0f);
        if(ref != NULL){
            ref->shadow = false;
            // nite::Color sc = bc.invert();
            // ref->setShadow(nite::Color(sc.r, sc.g, sc.b, 1.0f), nite::Vec2(1.0f));
        }  	
    }else{
        auto total = size.avg() * 0.65f;
        nite::Vec2 is(buttonImage.getSize());
        while(is.avg() > total){
            is.x *= 0.90f;
            is.y *= 0.90f;
        }
        nite::setColor(tc); 
        auto *ref = buttonImage.draw(p.x, p.y - is.y * 0.09f, is.x, is.y, 0.5f, 0.5f, 0.0f);
        if(ref != NULL){
            ref->smooth = true;
        }
    }
}